

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O1

aiMaterial * __thiscall
Assimp::MMDImporter::CreateMaterial(MMDImporter *this,PmxMaterial *pMat,PmxModel *pModel)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  aiMaterial *this_00;
  long lVar3;
  size_t sVar4;
  float shininess;
  float opacity;
  aiColor3D ambient;
  aiColor3D specular;
  aiColor3D diffuse;
  int mapping_uvwsrc;
  aiString name;
  float local_864;
  float local_860;
  undefined8 local_85c;
  float local_854;
  undefined8 local_850;
  float local_848;
  undefined8 local_844;
  float local_83c;
  aiString local_838;
  aiString local_434;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  uVar1 = (pMat->material_english_name)._M_string_length;
  sVar4 = uVar1 & 0xffffffff;
  if ((uVar1 & 0xfffffc00) != 0) {
    sVar4 = 0x3ff;
  }
  local_434.length = (ai_uint32)sVar4;
  memcpy(local_434.data,(pMat->material_english_name)._M_dataplus._M_p,sVar4);
  local_434.data[sVar4] = '\0';
  aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
  local_844 = *(undefined8 *)pMat->diffuse;
  local_83c = pMat->diffuse[2];
  aiMaterial::AddBinaryProperty(this_00,&local_844,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  local_850 = *(undefined8 *)pMat->specular;
  local_848 = pMat->specular[2];
  aiMaterial::AddBinaryProperty(this_00,&local_850,0xc,"$clr.specular",0,0,aiPTI_Float);
  local_85c = *(undefined8 *)pMat->ambient;
  local_854 = pMat->ambient[2];
  aiMaterial::AddBinaryProperty(this_00,&local_85c,0xc,"$clr.ambient",0,0,aiPTI_Float);
  local_860 = pMat->diffuse[3];
  aiMaterial::AddBinaryProperty(this_00,&local_860,4,"$mat.opacity",0,0,aiPTI_Float);
  local_864 = pMat->specularlity;
  aiMaterial::AddBinaryProperty(this_00,&local_864,4,"$mat.shinpercent",0,0,aiPTI_Float);
  lVar3 = (long)pMat->diffuse_texture_index;
  if (-1 < lVar3) {
    pbVar2 = (pModel->textures)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    uVar1 = pbVar2[lVar3]._M_string_length;
    sVar4 = 0x3ff;
    if ((uVar1 & 0xfffffc00) == 0) {
      sVar4 = uVar1 & 0xffffffff;
    }
    local_838.length = (ai_uint32)sVar4;
    memcpy(local_838.data,pbVar2[lVar3]._M_dataplus._M_p,sVar4);
    local_838.data[sVar4] = '\0';
    aiMaterial::AddProperty(this_00,&local_838,"$tex.file",1,0);
  }
  local_838.length = 0;
  aiMaterial::AddBinaryProperty(this_00,&local_838,4,"$tex.uvwsrc",1,0,aiPTI_Integer);
  return this_00;
}

Assistant:

aiMaterial *MMDImporter::CreateMaterial(const pmx::PmxMaterial *pMat,
                                        const pmx::PmxModel *pModel) {
  aiMaterial *mat = new aiMaterial();
  aiString name(pMat->material_english_name);
  mat->AddProperty(&name, AI_MATKEY_NAME);

  aiColor3D diffuse(pMat->diffuse[0], pMat->diffuse[1], pMat->diffuse[2]);
  mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
  aiColor3D specular(pMat->specular[0], pMat->specular[1], pMat->specular[2]);
  mat->AddProperty(&specular, 1, AI_MATKEY_COLOR_SPECULAR);
  aiColor3D ambient(pMat->ambient[0], pMat->ambient[1], pMat->ambient[2]);
  mat->AddProperty(&ambient, 1, AI_MATKEY_COLOR_AMBIENT);

  float opacity = pMat->diffuse[3];
  mat->AddProperty(&opacity, 1, AI_MATKEY_OPACITY);
  float shininess = pMat->specularlity;
  mat->AddProperty(&shininess, 1, AI_MATKEY_SHININESS_STRENGTH);

  if(pMat->diffuse_texture_index >= 0) {
      aiString texture_path(pModel->textures[pMat->diffuse_texture_index]);
      mat->AddProperty(&texture_path, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
  }

  int mapping_uvwsrc = 0;
  mat->AddProperty(&mapping_uvwsrc, 1,
                   AI_MATKEY_UVWSRC(aiTextureType_DIFFUSE, 0));

  return mat;
}